

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_create_idle_stream
              (nghttp2_session *session,int32_t stream_id,nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  nghttp2_priority_spec pri_spec_copy;
  nghttp2_stream *stream;
  uint8_t in_stack_00000033;
  int32_t in_stack_00000034;
  nghttp2_session *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  int32_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  if (*(char *)(in_RDI + 0xb72) == '\x01') {
    local_4 = 0;
  }
  else {
    if (((in_ESI != 0) && (in_ESI != *in_RDX)) &&
       (iVar1 = session_detect_idle_stream
                          ((nghttp2_session *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0),
       iVar1 != 0)) {
      pnVar2 = nghttp2_session_get_stream_raw
                         ((nghttp2_session *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      if (pnVar2 != (nghttp2_stream *)0x0) {
        return -0x1f5;
      }
      nghttp2_priority_spec_normalize_weight((nghttp2_priority_spec *)&stack0xffffffffffffffcc);
      pnVar2 = nghttp2_session_open_stream
                         (in_stack_00000038,in_stack_00000034,in_stack_00000033,
                          (nghttp2_priority_spec *)session,stream_id,pri_spec);
      if (pnVar2 == (nghttp2_stream *)0x0) {
        return -0x385;
      }
      return 0;
    }
    local_4 = -0x1f5;
  }
  return local_4;
}

Assistant:

int nghttp2_session_create_idle_stream(nghttp2_session *session,
                                       int32_t stream_id,
                                       const nghttp2_priority_spec *pri_spec) {
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec_copy;

  if (session->pending_no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || stream_id == pri_spec->stream_id ||
      !session_detect_idle_stream(session, stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  pri_spec_copy = *pri_spec;
  nghttp2_priority_spec_normalize_weight(&pri_spec_copy);

  stream =
    nghttp2_session_open_stream(session, stream_id, NGHTTP2_STREAM_FLAG_NONE,
                                &pri_spec_copy, NGHTTP2_STREAM_IDLE, NULL);
  if (!stream) {
    return NGHTTP2_ERR_NOMEM;
  }

  /* We don't intentionally call nghttp2_session_adjust_idle_stream()
     so that idle stream created by this function, and existing ones
     are kept for application.  We will adjust number of idle stream
     in nghttp2_session_mem_send2 or nghttp2_session_mem_recv2 is
     called. */
  return 0;
}